

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffpbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  uint uVar2;
  FITSfile *pFVar3;
  int iVar4;
  long lVar5;
  void *__src;
  size_t __n;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long local_70;
  ulong local_60;
  
  iVar4 = *status;
  if (iVar4 < 1) {
    pFVar3 = fptr->Fptr;
    if (fptr->HDUposition != pFVar3->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      pFVar3 = fptr->Fptr;
    }
    uVar2 = pFVar3->curbuf;
    if ((int)uVar2 < 0) {
      ffldrc(fptr,pFVar3->bytepos / 0xb40,0,status);
      pFVar3 = fptr->Fptr;
      uVar2 = pFVar3->curbuf;
    }
    local_60 = (ulong)uVar2;
    local_70 = pFVar3->bufrecnum[(int)uVar2];
    lVar5 = local_70 * -0xb40 + pFVar3->bytepos;
    sVar8 = 0xb40 - lVar5;
    pcVar7 = pFVar3->iobuffer + lVar5 + (int)(uVar2 * 0xb40);
    lVar5 = 1;
    while( true ) {
      __n = gsize;
      if ((long)sVar8 < gsize) {
        __n = sVar8;
      }
      memcpy(pcVar7,buffer,__n);
      iVar4 = (int)local_60;
      if (ngroups <= lVar5) break;
      __src = (void *)(__n + (long)buffer);
      if ((long)sVar8 < gsize) {
        fptr->Fptr->dirty[iVar4] = 1;
        local_70 = local_70 + 1;
        ffldrc(fptr,local_70,1,status);
        local_60 = (ulong)fptr->Fptr->curbuf;
        pcVar7 = fptr->Fptr->iobuffer + local_60 * 0xb40;
        memcpy(pcVar7,__src,gsize - __n);
        __src = (void *)((long)buffer + gsize);
        lVar6 = (gsize - __n) + offset;
        pcVar7 = pcVar7 + lVar6;
        sVar8 = 0xb40 - lVar6;
      }
      else {
        pcVar7 = pcVar7 + __n + offset;
        sVar8 = sVar8 - (__n + offset);
      }
      if ((long)sVar8 < 1) {
        fptr->Fptr->dirty[(int)local_60] = 1;
        local_70 = local_70 + (0xb40 - sVar8) / 0xb40;
        ffldrc(fptr,local_70,1,status);
        local_60 = (ulong)fptr->Fptr->curbuf;
        uVar9 = -sVar8;
        sVar8 = 0xb40 - uVar9 % 0xb40;
        pcVar7 = fptr->Fptr->iobuffer + uVar9 % 0xb40 + local_60 * 0xb40;
      }
      lVar5 = lVar5 + 1;
      buffer = __src;
    }
    if ((long)sVar8 < gsize) {
      fptr->Fptr->dirty[iVar4] = 1;
      ffldrc(fptr,local_70 + 1,1,status);
      iVar4 = fptr->Fptr->curbuf;
      memcpy(fptr->Fptr->iobuffer + (long)iVar4 * 0xb40,(void *)((long)buffer + __n),gsize - __n);
    }
    pFVar3 = fptr->Fptr;
    pFVar3->dirty[iVar4] = 1;
    pLVar1 = &pFVar3->bytepos;
    *pLVar1 = *pLVar1 + (ngroups + -1) * offset + gsize * ngroups;
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffpbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to write           */
           long offset,       /* I - size of gap between groups          */
           void *buffer,      /* I - buffer to be written                */
           int *status)       /* IO - error status                       */
/*
  put (write) the buffer of bytes to the output FITS file, with an offset
  between each group of bytes.  This function combines ffmbyt and ffpbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nwrite, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* write all but the last group */
    {
      /* copy bytes from user's buffer to the IO buffer */
      nwrite = minvalue(gsize, nspace);
      memcpy(ioptr, cptr, nwrite);
      cptr += nwrite;          /* increment buffer pointer */

      if (nwrite < gsize)        /* entire group did not fit */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
        record++;
        ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nwrite  = gsize - nwrite;
        memcpy(ioptr, cptr, nwrite);
        cptr   += nwrite;            /* increment buffer pointer */
        ioptr  += (offset + nwrite); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nwrite;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nwrite);  /* increment IO bufer pointer */
        nspace -= (offset + nwrite);
      }

      if (nspace <= 0) /* beyond current record? */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;
        record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
        ffldrc(fptr, record, IGNORE_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  
      }
    }
      
    /* now write the last group */
    nwrite = minvalue(gsize, nspace);
    memcpy(ioptr, cptr, nwrite);
    cptr += nwrite;          /* increment buffer pointer */

    if (nwrite < gsize)        /* entire group did not fit */
    {
      (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
      record++;
      ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nwrite  = gsize - nwrite;
      memcpy(ioptr, cptr, nwrite);
    }

    (fptr->Fptr)->dirty[bcurrent] = TRUE;    /* mark record as having been modified */
    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}